

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_traits.h
# Opt level: O0

Field google::protobuf::json_internal::Proto3Type::MustHaveField(Desc *d,int32_t number)

{
  bool bVar1;
  LogMessage *pLVar2;
  Field **ppFVar3;
  optional<const_google::protobuf::json_internal::ResolverPool::Field_*> oVar4;
  string_view local_98 [2];
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)524292,_(absl::lts_20240722::FormatConversionCharSet)655355>
  local_78;
  string local_68;
  LogMessageFatal local_48 [23];
  Voidify local_31;
  _Storage<const_google::protobuf::json_internal::ResolverPool::Field_*,_true> local_30;
  optional<const_google::protobuf::json_internal::ResolverPool::Field_*> f;
  int32_t number_local;
  Desc *d_local;
  
  f.super__Optional_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_true,_true>.
  _M_payload.
  super__Optional_payload_base<const_google::protobuf::json_internal::ResolverPool::Field_*>._12_4_
       = number;
  oVar4 = FieldByNumber(d,number);
  local_30 = oVar4.
             super__Optional_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_true,_true>
             ._M_payload.
             super__Optional_payload_base<const_google::protobuf::json_internal::ResolverPool::Field_*>
             ._M_payload;
  f.super__Optional_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_true,_true>.
  _M_payload.
  super__Optional_payload_base<const_google::protobuf::json_internal::ResolverPool::Field_*>.
  _M_payload._0_1_ =
       oVar4.
       super__Optional_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_true,_true>
       ._M_payload.
       super__Optional_payload_base<const_google::protobuf::json_internal::ResolverPool::Field_*>.
       _M_engaged;
  bVar1 = std::optional<const_google::protobuf::json_internal::ResolverPool::Field_*>::has_value
                    ((optional<const_google::protobuf::json_internal::ResolverPool::Field_*> *)
                     &local_30);
  if (!bVar1) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/json/internal/descriptor_traits.h"
               ,0x154);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_48);
    absl::lts_20240722::str_format_internal::
    FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)524292,_(absl::lts_20240722::FormatConversionCharSet)655355>
    ::FormatSpecTemplate
              (&local_78,
               "%s has, by definition, a field numbered %d, but it could not be looked up; this is a bug"
              );
    local_98[0] = TypeName(d);
    absl::lts_20240722::StrFormat<std::basic_string_view<char,_std::char_traits<char>_>,_int>
              (&local_68,&local_78,local_98,
               (int *)&f.
                       super__Optional_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<const_google::protobuf::json_internal::ResolverPool::Field_*>
                       .field_0xc);
    pLVar2 = (LogMessage *)
             absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar2,(string *)&local_68);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_31,pLVar2);
    std::__cxx11::string::~string((string *)&local_68);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_48);
  }
  ppFVar3 = std::optional<const_google::protobuf::json_internal::ResolverPool::Field_*>::operator*
                      ((optional<const_google::protobuf::json_internal::ResolverPool::Field_*> *)
                       &local_30);
  return *ppFVar3;
}

Assistant:

static Field MustHaveField(const Desc& d, int32_t number,
                             JsonLocation::SourceLocation loc =
                                 JsonLocation::SourceLocation::current()) {
    auto f = FieldByNumber(d, number);
    if (!f.has_value()) {
      ABSL_LOG(FATAL)
          << absl::StrFormat(
                 "%s has, by definition, a field numbered %d, but it could not "
                 "be "
                 "looked up; this is a bug",
                 TypeName(d), number);
    }
    return *f;
  }